

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_defaultPrintString(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t tuple_00;
  sysbvm_tuple_t typeName;
  sysbvm_tuple_t thisTypeName;
  sysbvm_tuple_t type;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  sVar2 = sysbvm_tuple_getType(context,tuple);
  if (sVar2 != 0) {
    _Var1 = sysbvm_type_isDirectSubtypeOf(sVar2,(context->roots).typeType);
    if (_Var1) {
      tuple_00 = sysbvm_type_getName(tuple);
      _Var1 = sysbvm_tuple_isNonNullPointer(tuple_00);
      if (_Var1) {
        return tuple_00;
      }
    }
    sVar2 = sysbvm_type_getName(sVar2);
    _Var1 = sysbvm_tuple_isNonNullPointer(sVar2);
    if (_Var1) {
      sVar2 = sysbvm_string_createWithPrefix(context,"a ",sVar2);
      return sVar2;
    }
  }
  sVar2 = sysbvm_string_createWithCString(context,"TODO: defaultPrintString");
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_defaultPrintString(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type != SYSBVM_NULL_TUPLE)
    {
        // Is the tuple a type?
        if(sysbvm_type_isDirectSubtypeOf(type, context->roots.typeType))
        {
            sysbvm_tuple_t thisTypeName = sysbvm_type_getName(tuple);
            if(sysbvm_tuple_isNonNullPointer(thisTypeName))   
                return thisTypeName;
        }

        sysbvm_tuple_t typeName = sysbvm_type_getName(type);
        if(sysbvm_tuple_isNonNullPointer(typeName))
            return sysbvm_string_createWithPrefix(context, "a ", typeName);
    }

    return sysbvm_string_createWithCString(context, "TODO: defaultPrintString");
}